

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  ushort uVar1;
  TRef TVar2;
  long lVar3;
  ushort *puVar4;
  long in_RDI;
  bool bVar5;
  IRIns *irb_1;
  IRIns *ira;
  IRIns *irs;
  IRRef ref;
  IRIns *irb;
  ushort *local_38;
  jit_State *in_stack_ffffffffffffffd0;
  GCobj *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  
  if ((*(uint *)(in_RDI + 0x90) & 0x10000) != 0) {
    if (*(char *)(in_RDI + 0xad) == 'S') {
      if ((*(ushort *)(in_RDI + 0xaa) & 1) == 0) {
        TVar2 = lj_ir_kgc((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                          ,in_stack_ffffffffffffffd8,
                          (IRType)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
        return TVar2;
      }
      *(undefined2 *)(in_RDI + 0xa0) = *(undefined2 *)(in_RDI + 0xa8);
      *(undefined2 *)(in_RDI + 0xa2) = *(undefined2 *)(in_RDI + 0xae);
      TVar2 = lj_opt_cse((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
      ;
      return TVar2;
    }
    if (((*(char *)(in_RDI + 0xad) == 'T') &&
        (lVar3 = *(long *)(in_RDI + 0x10) + (ulong)*(ushort *)(in_RDI + 0xa8) * 8,
        *(char *)(lVar3 + 5) == 'S')) && ((*(ushort *)(lVar3 + 2) & 1) == 0)) {
      return (uint)*(ushort *)(in_RDI + 0xaa);
    }
  }
  if ((*(uint *)(in_RDI + 0x90) & 0x20000) != 0) {
    uVar1 = *(ushort *)(in_RDI + 0x22c);
    while (uVar6 = (uint)uVar1, uVar6 != 0) {
      puVar4 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)uVar6 * 8);
      in_stack_ffffffffffffffd0 = (jit_State *)(in_RDI + 0xa8);
      local_38 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)*puVar4 * 8);
      while( true ) {
        bVar5 = false;
        if ((in_stack_ffffffffffffffd0->cur).gct == *(uint8_t *)((long)local_38 + 5)) {
          bVar5 = *(ushort *)((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2) ==
                  local_38[1];
        }
        if (!bVar5) break;
        if (((in_stack_ffffffffffffffd0->cur).gct == 'S') &&
           (((in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 & 0x10000) == 0)) {
          return uVar6;
        }
        if (((in_stack_ffffffffffffffd0->cur).gct == '_') &&
           (*(short *)((long)&(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 + 2) == 0x17)) break;
        in_stack_ffffffffffffffd0 =
             (jit_State *)
             (*(long *)(in_RDI + 0x10) +
             (ulong)(ushort)(in_stack_ffffffffffffffd0->cur).nextgc.gcptr32 * 8);
        local_38 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)*local_38 * 8);
      }
      uVar1 = puVar4[3];
    }
  }
  TVar2 = lj_ir_emit(in_stack_ffffffffffffffd0);
  return TVar2;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (!(fleft->op2 & IRBUFHDR_APPEND))  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && !(irb->op2 & IRBUFHDR_APPEND))
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && !(ira->op2 & IRBUFHDR_APPEND))
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}